

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_DropItem
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int dropamount;
  char *pcVar2;
  PClassActor *type;
  AActor *source;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_003ec670;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ec657:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ec670:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1675,
                  "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  source = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_003ec5a7;
    bVar1 = DObject::IsKindOf((DObject *)source,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ec670;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_003ec657;
LAB_003ec5a7:
    source = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_003ec68f;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003ec660:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ec68f:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1676,
                  "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003ec5f3;
    bVar1 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)type);
    if (!bVar1) {
      pcVar2 = "spawntype == NULL || spawntype->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ec68f;
    }
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003ec660;
LAB_003ec5f3:
    type = (PClassActor *)0x0;
  }
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar2 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003ec6b7;
    }
    dropamount = param[2].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar2 = "(param[paramnum]).Type == REGT_INT";
LAB_003ec6b7:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1677,
                    "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    dropamount = param[2].field_0.i;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type == '\0') goto LAB_003ec63e;
      pcVar2 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ec6d6;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type == '\0') {
LAB_003ec63e:
    P_DropItem(source,type,dropamount,param[3].field_0.i);
    return 0;
  }
  pcVar2 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ec6d6:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1678,
                "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DropItem)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS   (spawntype, AActor);
	PARAM_INT_DEF(amount);
	PARAM_INT_DEF(chance);

	P_DropItem(self, spawntype, amount, chance);
	return 0;
}